

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Selector.cpp
# Opt level: O3

void __thiscall Selector::removeListener(Selector *this,int fd,SelectorListener *listener)

{
  Node **ppNVar1;
  iterator iVar2;
  Node *pNVar3;
  bool bVar4;
  iterator ret;
  AutoLock l;
  iterator local_40;
  AutoLock local_38;
  
  AutoLock::AutoLock(&local_38,&this->mLock);
  iVar2.mNode = ((this->mList).mHead)->next;
  pNVar3 = (this->mList).mTail;
  if (iVar2.mNode != pNVar3) {
    bVar4 = false;
    do {
      while ((iVar2.mNode)->val->mFd == fd) {
        operator_delete((iVar2.mNode)->val,0x18);
        JetHead::list<Selector::ListenerNode_*>::iterator::erase(&local_40);
        pNVar3 = (this->mList).mTail;
        bVar4 = true;
        iVar2.mNode = local_40.mNode;
        if (pNVar3 == local_40.mNode) goto LAB_0011df92;
      }
      ppNVar1 = &(iVar2.mNode)->next;
      iVar2.mNode = *ppNVar1;
    } while (*ppNVar1 != pNVar3);
    if (bVar4) {
LAB_0011df92:
      updateListeners(this);
    }
  }
  AutoLock::~AutoLock(&local_38);
  return;
}

Assistant:

void Selector::removeListener( int fd, SelectorListener *listener )
{
	TRACE_BEGIN( LOG_LVL_INFO );

	AutoLock l( mLock );
	ListenerNode n( fd, NULL );
	bool update = false;
	
	JetHead::list<ListenerNode*>::iterator i = mList.begin(); 
	while (i != mList.end())
	{
		if (*(*i) == n)
		{
			update = true;
			delete *i;
			i = i.erase();
		} 
		else 
		{
			++i;
		}
	}
		
	if ( update )
	{
		updateListeners();		
	}
}